

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O1

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  byte bVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  void *TgtPtrBegin;
  iterator __position;
  bool bVar9;
  uint uVar10;
  byte bVar11;
  undefined8 *HstPtrBegin;
  ulong uVar12;
  bool bVar13;
  bool IsLast;
  bool local_81;
  DeviceTy *local_80;
  int64_t local_78;
  pthread_mutex_t *local_70;
  void **local_68;
  int64_t *local_60;
  _Base_ptr local_58;
  void *local_50;
  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
  *local_48;
  ulong local_40;
  int64_t *local_38;
  
  bVar9 = 0 < arg_num;
  if (0 < arg_num) {
    local_70 = (pthread_mutex_t *)&Device->ShadowMtx;
    local_48 = (_Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                *)&Device->ShadowPtrMap;
    local_58 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_40 = (ulong)(uint)arg_num;
    uVar12 = local_40;
    local_80 = Device;
    local_68 = args;
    local_60 = arg_types;
    local_38 = arg_sizes;
    do {
      uVar1 = uVar12 - 1;
      uVar3 = arg_types[uVar12 - 1];
      uVar10 = (uint)uVar3;
      if ((uVar3 & 0x180) == 0) {
        HstPtrBegin = (undefined8 *)local_68[uVar1];
        local_78 = local_38[uVar1];
        if ((((long)uVar12 < (long)local_40 && uVar3 < 0x1000000000000) &&
            (uVar12 == *(ushort *)((long)arg_types + uVar12 * 8 + 6))) &&
           (lVar8 = (long)HstPtrBegin % 8, lVar8 != 0)) {
          HstPtrBegin = (undefined8 *)((long)HstPtrBegin - lVar8);
          local_78 = local_78 + lVar8;
        }
        TgtPtrBegin = DeviceTy::getTgtPtrBegin
                                (local_80,HstPtrBegin,local_78,&local_81,
                                 (bool)((byte)((uVar10 & 0x10) >> 4) | uVar3 < 0x1000000000000));
        uVar3 = arg_types[uVar1];
        bVar5 = (byte)(((uint)uVar3 & 0x10) >> 4) | uVar3 < 0x1000000000000;
        bVar11 = ((byte)((uVar10 & 8) >> 3) | local_81) & bVar5;
        if (((uVar3 & 2) != 0) || (arg_types = local_60, bVar11 != 0)) {
          if ((uVar3 & 2) != 0) {
            if (bVar5 == 0) {
              local_50 = TgtPtrBegin;
              lVar8 = DeviceTy::getMapEntryRefCnt(local_80,local_68[(uVar3 >> 0x30) - 1]);
              bVar13 = lVar8 == 1;
              TgtPtrBegin = local_50;
            }
            else {
              bVar13 = false;
            }
            if (((byte)((byte)(((uint)uVar3 & 4) >> 2) | bVar13 | bVar11) == 1) &&
               (iVar6 = DeviceTy::data_retrieve(local_80,HstPtrBegin,TgtPtrBegin,local_78),
               iVar6 != 0)) break;
          }
          iVar7 = pthread_mutex_lock(local_70);
          if (iVar7 != 0) {
            std::__throw_system_error(iVar7);
          }
          __position._M_node =
               (local_80->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (__position._M_node != local_58) {
            puVar2 = (undefined8 *)(local_78 + (long)HstPtrBegin);
            do {
              puVar4 = *(undefined8 **)(__position._M_node + 1);
              if (puVar4 < HstPtrBegin) {
                __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
                iVar7 = 6;
              }
              else {
                iVar7 = 5;
                if (puVar4 < puVar2) {
                  if ((*(byte *)(local_60 + uVar1) & 2) != 0) {
                    *puVar4 = __position._M_node[1]._M_parent;
                  }
                  if (bVar11 == 0) {
                    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
                  }
                  else {
                    __position = std::
                                 _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                                 ::erase_abi_cxx11_(local_48,__position);
                  }
                  iVar7 = 0;
                }
              }
            } while (((iVar7 == 6) || (iVar7 == 0)) && (__position._M_node != local_58));
          }
          pthread_mutex_unlock(local_70);
          arg_types = local_60;
          if ((bVar11 != 0) &&
             (iVar7 = DeviceTy::deallocTgtPtr
                                (local_80,HstPtrBegin,local_78,SUB41((uVar10 & 8) >> 3,0)),
             arg_types = local_60, iVar7 != 0)) break;
        }
      }
      bVar9 = 1 < (long)uVar12;
      bVar13 = 1 < (long)uVar12;
      uVar12 = uVar1;
    } while (bVar13);
  }
  return -(uint)bVar9;
}

Assistant:

int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t data_size = arg_sizes[i];
    // Adjust for proper alignment if this is a combined entry (for structs).
    // Look at the next argument - if that is MEMBER_OF this one, then this one
    // is a combined entry.
    int64_t padding = 0;
    const int next_i = i+1;
    if (member_of(arg_types[i]) < 0 && next_i < arg_num &&
        member_of(arg_types[next_i]) == i) {
      padding = (int64_t)HstPtrBegin % alignment;
      if (padding) {
        DP("Using a padding of %" PRId64 " bytes for begin address " DPxMOD
            "\n", padding, DPxPTR(HstPtrBegin));
        HstPtrBegin = (char *) HstPtrBegin - padding;
        data_size += padding;
      }
    }

    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, data_size, IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", data_size, DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          int32_t parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              data_size, DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, data_size);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            return OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + data_size;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
           it != Device.ShadowPtrMap.end();) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb) {
          ++it;
          continue;
        }
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          it = Device.ShadowPtrMap.erase(it);
        } else {
          ++it;
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, data_size, ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          return OFFLOAD_FAIL;
        }
      }
    }
  }

  return OFFLOAD_SUCCESS;
}